

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O2

unique_ptr<Catch::CumulativeReporterBase::SectionNode> __thiscall
Catch::Detail::make_unique<Catch::CumulativeReporterBase::SectionNode,Catch::SectionStats&>
          (Detail *this,SectionStats *args)

{
  SectionNode *this_00;
  
  this_00 = (SectionNode *)operator_new(0xd0);
  CumulativeReporterBase::SectionNode::SectionNode(this_00,args);
  *(SectionNode **)this = this_00;
  return (unique_ptr<Catch::CumulativeReporterBase::SectionNode>)(SectionNode *)this;
}

Assistant:

unique_ptr<T> make_unique(Args&&... args) {
        return unique_ptr<T>(new T(CATCH_FORWARD(args)...));
    }